

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O2

string * __thiscall
glcts::(anonymous_namespace)::ShaderImageLoadStoreBase::ToString<tcu::Vector<float,4>>
          (string *__return_storage_ptr__,ShaderImageLoadStoreBase *this,Vector<float,_4> *v)

{
  ostream *poVar1;
  bool *pbVar2;
  int i;
  long lVar3;
  ostringstream s;
  ostream oStack_1a8;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oStack_1a8);
  std::operator<<(&oStack_1a8,"[");
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<(&oStack_1a8,*(float *)(this + lVar3 * 4));
    pbVar2 = (bool *)0x19002bd;
    if (lVar3 == 3) {
      pbVar2 = fixed_sample_locations_values + 1;
    }
    std::operator<<(poVar1,pbVar2);
  }
  std::operator<<(&oStack_1a8,"]");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oStack_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString(T v)
	{
		std::ostringstream s;
		s << "[";
		for (int i = 0; i < 4; ++i)
			s << v[i] << (i == 3 ? "" : ",");
		s << "]";
		return s.str();
	}